

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_x86.cpp
# Opt level: O3

int __thiscall
ncnn::ConvolutionDepthWise_x86::forward
          (ConvolutionDepthWise_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  int iVar2;
  int iVar3;
  _func_int *p_Var4;
  size_t _elemsize;
  Option *opt_00;
  Layer *pLVar5;
  int *piVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  Option opt_g;
  Mat local_128;
  long local_e8;
  long local_e0;
  void *local_d8;
  int *local_d0;
  ulong local_c8;
  int local_c0;
  Allocator *local_b8;
  undefined4 local_b0;
  int local_ac;
  int local_a8;
  int local_a4;
  ulong local_a0;
  void *local_98;
  int *local_90;
  ulong local_88;
  int local_80;
  Allocator *local_78;
  undefined4 local_70;
  int local_6c;
  int local_68;
  int local_64;
  ulong local_60;
  undefined4 local_58;
  int iStack_54;
  Allocator *pAStack_50;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined8 local_38;
  
  p_Var4 = this->_vptr_ConvolutionDepthWise_x86[-3];
  if ((opt->use_int8_inference == true) && (*(long *)(&this->field_0x150 + (long)p_Var4) == 1)) {
    iVar7 = forward_int8_x86(this,bottom_blob,top_blob,opt);
    return iVar7;
  }
  iVar7 = bottom_blob->c;
  _elemsize = bottom_blob->elemsize;
  iVar1 = *(int *)(&this->field_0xbc + (long)p_Var4);
  iVar8 = *(int *)(&this->field_0xc0 + (long)p_Var4);
  iVar2 = *(int *)(&this->field_0xc4 + (long)p_Var4);
  iVar3 = *(int *)(&this->field_0xc8 + (long)p_Var4);
  local_128.elemsize._0_4_ = 0;
  local_128.elemsize._4_4_ = 0;
  local_128.elempack = 0;
  local_128.data = (void *)0x0;
  local_128.refcount._0_4_ = 0;
  local_128.refcount._4_4_ = 0;
  local_128.allocator = (Allocator *)0x0;
  local_128.dims = 0;
  local_128.w = 0;
  local_128.h = 0;
  local_128.c = 0;
  local_128.cstep = 0;
  ConvolutionDepthWise::make_padding
            ((ConvolutionDepthWise *)((long)&this->_vptr_ConvolutionDepthWise_x86 + (long)p_Var4),
             bottom_blob,&local_128,opt);
  iVar10 = -100;
  if ((local_128.data == (void *)0x0) || ((long)local_128.c * local_128.cstep == 0))
  goto LAB_00154897;
  p_Var4 = this->_vptr_ConvolutionDepthWise_x86[-3];
  Mat::create(top_blob,(~((iVar1 + -1) * iVar2) + local_128.w) /
                       *(int *)(&this->field_0xcc + (long)p_Var4) + 1,
              (~((iVar8 + -1) * iVar3) + local_128.h) / *(int *)(&this->field_0xd0 + (long)p_Var4) +
              1,*(int *)(&this->field_0xb8 + (long)p_Var4),_elemsize,opt->blob_allocator);
  if ((top_blob->data == (void *)0x0) || ((long)top_blob->c * top_blob->cstep == 0))
  goto LAB_00154897;
  opt_00 = (Option *)this->_vptr_ConvolutionDepthWise_x86[-3];
  iVar1 = *(int *)(&this->field_0xf0 + (long)opt_00);
  iVar8 = *(int *)(&this->field_0xb8 + (long)opt_00);
  if ((*(int *)(&this->field_0xb8 + (long)opt_00) == iVar7 && iVar7 == iVar1) &&
     ((iVar8 = iVar7, *(int *)(&this->field_0xbc + (long)opt_00) == 3 &&
      (*(int *)(&this->field_0xc0 + (long)opt_00) == 3)))) {
    if ((*(int *)(&this->field_0xc4 + (long)opt_00) == 1) &&
       (((*(int *)(&this->field_0xc8 + (long)opt_00) == 1 &&
         (*(int *)(&this->field_0xcc + (long)opt_00) == 1)) &&
        (*(int *)(&this->field_0xd0 + (long)opt_00) == 1)))) {
      convdw3x3s1_sse(&local_128,top_blob,*(Mat **)(&this->field_0x140 + (long)opt_00),
                      *(Mat **)(&this->field_0x180 + (long)opt_00),opt_00);
    }
    else {
      if ((((*(int *)(&this->field_0xc4 + (long)opt_00) != 1) ||
           (*(int *)(&this->field_0xc8 + (long)opt_00) != 1)) ||
          (*(int *)(&this->field_0xcc + (long)opt_00) != 2)) ||
         (*(int *)(&this->field_0xd0 + (long)opt_00) != 2)) goto LAB_00154667;
      convdw3x3s2_sse(&local_128,top_blob,*(Mat **)(&this->field_0x140 + (long)opt_00),
                      *(Mat **)(&this->field_0x180 + (long)opt_00),opt_00);
    }
    pLVar5 = this->activation;
    if (pLVar5 != (Layer *)0x0) {
      (*pLVar5->_vptr_Layer[9])(pLVar5,top_blob,opt);
    }
  }
  else {
LAB_00154667:
    if (0 < iVar1) {
      local_e0 = (long)(iVar7 / iVar1);
      local_e8 = (long)(iVar8 / iVar1);
      lVar9 = 0;
      lVar12 = 0;
      lVar11 = 0;
      do {
        local_88 = CONCAT44(local_128.elemsize._4_4_,(undefined4)local_128.elemsize);
        local_98 = (void *)(local_128.cstep * lVar9 * local_88 + (long)local_128.data);
        local_90 = (int *)0x0;
        local_80 = local_128.elempack;
        local_78 = local_128.allocator;
        local_70 = 3;
        local_6c = local_128.w;
        local_68 = local_128.h;
        local_60 = ((long)(local_128.h * local_128.w) * local_88 + 0xf & 0xfffffffffffffff0) /
                   local_88;
        local_ac = top_blob->w;
        local_c8 = top_blob->elemsize;
        local_d8 = (void *)(top_blob->cstep * lVar12 * local_c8 + (long)top_blob->data);
        local_a8 = top_blob->h;
        local_c0 = top_blob->elempack;
        local_b8 = top_blob->allocator;
        local_d0 = (int *)0x0;
        local_b0 = 3;
        local_a0 = ((long)(local_a8 * local_ac) * local_c8 + 0xf & 0xfffffffffffffff0) / local_c8;
        pLVar5 = (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar11];
        local_58 = *(undefined4 *)opt;
        iStack_54 = opt->num_threads;
        local_48 = *(undefined4 *)&opt->workspace_allocator;
        uStack_44 = *(undefined4 *)((long)&opt->workspace_allocator + 4);
        uStack_40._0_1_ = opt->use_winograd_convolution;
        uStack_40._1_1_ = opt->use_sgemm_convolution;
        uStack_40._2_1_ = opt->use_int8_inference;
        uStack_40._3_1_ = opt->use_vulkan_compute;
        uStack_3c._0_1_ = opt->use_fp16_packed;
        uStack_3c._1_1_ = opt->use_fp16_storage;
        uStack_3c._2_1_ = opt->use_fp16_arithmetic;
        uStack_3c._3_1_ = opt->use_int8_storage;
        local_38._0_1_ = opt->use_int8_arithmetic;
        local_38._1_1_ = opt->use_packing_layout;
        local_38._2_1_ = opt->use_shader_pack8;
        local_38._3_1_ = opt->use_bf16_storage;
        local_38._4_4_ = *(undefined4 *)&opt->field_0x24;
        local_a4 = iVar8 / iVar1;
        local_64 = iVar7 / iVar1;
        pAStack_50 = local_b8;
        (*pLVar5->_vptr_Layer[7])(pLVar5,&local_98,&local_d8,&local_58);
        if (local_d0 != (int *)0x0) {
          LOCK();
          *local_d0 = *local_d0 + -1;
          UNLOCK();
          if (*local_d0 == 0) {
            if (local_b8 == (Allocator *)0x0) {
              if (local_d8 != (void *)0x0) {
                free(local_d8);
              }
            }
            else {
              (**(code **)(*(long *)local_b8 + 0x18))();
            }
          }
        }
        if (local_90 != (int *)0x0) {
          LOCK();
          *local_90 = *local_90 + -1;
          UNLOCK();
          if (*local_90 == 0) {
            if (local_78 == (Allocator *)0x0) {
              if (local_98 != (void *)0x0) {
                free(local_98);
              }
            }
            else {
              (**(code **)(*(long *)local_78 + 0x18))();
            }
          }
        }
        lVar11 = lVar11 + 1;
        lVar12 = lVar12 + local_e8;
        lVar9 = lVar9 + local_e0;
      } while (lVar11 < *(int *)(&this->field_0xf0 + (long)this->_vptr_ConvolutionDepthWise_x86[-3])
              );
    }
  }
  iVar10 = 0;
LAB_00154897:
  piVar6 = (int *)CONCAT44(local_128.refcount._4_4_,local_128.refcount._0_4_);
  if (piVar6 != (int *)0x0) {
    LOCK();
    *piVar6 = *piVar6 + -1;
    UNLOCK();
    if (*piVar6 == 0) {
      if (local_128.allocator == (Allocator *)0x0) {
        if (local_128.data != (void *)0x0) {
          free(local_128.data);
        }
      }
      else {
        (**(code **)(*(long *)local_128.allocator + 0x18))();
      }
    }
  }
  return iVar10;
}

Assistant:

int ConvolutionDepthWise_x86::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // convolv with NxN kernel
    // value = value + bias

    if (opt.use_int8_inference && weight_data.elemsize == (size_t)1u)
    {
        return forward_int8_x86(bottom_blob, top_blob, opt);
    }

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    Mat bottom_blob_bordered;
    make_padding(bottom_blob, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;

    // float32
    top_blob.create(outw, outh, num_output, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // depth-wise
    if (channels == group && group == num_output)
    {
        if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convdw3x3s1_sse(bottom_blob_bordered, top_blob, weight_data, bias_data, opt);

            if (activation)
            {
                activation->forward_inplace(top_blob, opt);
            }

            return 0;
        }
        if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convdw3x3s2_sse(bottom_blob_bordered, top_blob, weight_data, bias_data, opt);

            if (activation)
            {
                activation->forward_inplace(top_blob, opt);
            }

            return 0;
        }
    }

    // group convolution
    const int channels_g = channels / group;
    const int num_output_g = num_output / group;

    for (int g=0; g<group; g++)
    {
        const Mat bottom_blob_bordered_g = bottom_blob_bordered.channel_range(channels_g * g, channels_g);
        Mat top_blob_g = top_blob.channel_range(num_output_g * g, num_output_g);

        const ncnn::Layer* op = group_ops[g];

        Option opt_g = opt;
        opt_g.blob_allocator = top_blob.allocator;

        // forward
        op->forward(bottom_blob_bordered_g, top_blob_g, opt_g);
    }

    return 0;
}